

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFixedBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  IndexRange range;
  IndexRange range_00;
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  LinkWrenches *in_RCX;
  LinkWrenches *in_RDX;
  LinkAccArray *in_RSI;
  long in_RDI;
  LinkWrenches *in_R8;
  VectorDynSize *in_R9;
  VectorDynSize *in_stack_00000008;
  BerdyHelper *in_stack_00000010;
  LinkIndex childLink;
  IJointConstPtr jnt;
  JointIndex jntIdx;
  LinkIndex linkIdx;
  BerdyHelper *subVec;
  VectorDynSize *this_00;
  BerdyHelper *pBVar5;
  VectorDynSize *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  BerdyHelper *in_stack_fffffffffffffe50;
  BerdyHelper *in_stack_fffffffffffffe58;
  BerdyHelper *in_stack_fffffffffffffe60;
  IndexRange in_stack_fffffffffffffe88;
  IndexRange in_stack_fffffffffffffe98;
  SpatialForceVector *in_stack_fffffffffffffeb8;
  long local_100;
  long local_38;
  
  if (*(int *)(in_RDI + 0x1b0) == 0) {
    for (local_38 = 0; lVar1 = iDynTree::Model::getNrOfLinks(), local_38 < lVar1;
        local_38 = local_38 + 1) {
      iDynTree::Traversal::getBaseLink();
      lVar1 = iDynTree::Link::getIndex();
      if (local_38 != lVar1) {
        in_stack_fffffffffffffe60 = in_stack_00000010;
        getRangeLinkVariable
                  (in_stack_fffffffffffffe50,
                   (BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                   (LinkIndex)in_stack_fffffffffffffe40);
        iDynTree::LinkAccArray::operator()(in_RSI,local_38);
        toEigen((SpatialMotionVector *)in_stack_fffffffffffffeb8);
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((VectorDynSize *)in_stack_fffffffffffffe88.size,in_stack_fffffffffffffe98,
                   (Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffffe88.offset);
        getRangeLinkVariable
                  (in_stack_fffffffffffffe50,
                   (BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                   (LinkIndex)in_stack_fffffffffffffe40);
        iDynTree::LinkWrenches::operator()(in_RDX,local_38);
        toEigen(in_stack_fffffffffffffeb8);
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((VectorDynSize *)in_stack_fffffffffffffe88.size,in_stack_fffffffffffffe98,
                   (Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffffe88.offset);
        if ((*(byte *)(in_RDI + 0x1b4) & 1) != 0) {
          in_stack_fffffffffffffe58 = in_stack_00000010;
          getRangeLinkVariable
                    (in_stack_fffffffffffffe50,
                     (BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                     (LinkIndex)in_stack_fffffffffffffe40);
          iDynTree::LinkWrenches::operator()(in_RCX,local_38);
          toEigen(in_stack_fffffffffffffeb8);
          setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                    ((VectorDynSize *)in_stack_fffffffffffffe88.size,in_stack_fffffffffffffe98,
                     (Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffffe88.offset);
        }
      }
    }
    local_100 = 0;
    while (lVar1 = local_100, lVar2 = iDynTree::Model::getNrOfJoints(), lVar1 < lVar2) {
      plVar3 = (long *)iDynTree::Model::getJoint(in_RDI);
      lVar2 = iDynTree::Traversal::getChildLinkIndexFromJointIndex((Model *)(in_RDI + 0x130),in_RDI)
      ;
      subVec = in_stack_00000010;
      getRangeJointVariable
                (in_stack_fffffffffffffe60,
                 (BerdyDynamicVariablesTypes)((ulong)in_stack_fffffffffffffe58 >> 0x20),lVar1);
      iDynTree::LinkWrenches::operator()(in_R8,lVar2);
      toEigen(in_stack_fffffffffffffeb8);
      setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                ((VectorDynSize *)in_stack_fffffffffffffe88.size,in_stack_fffffffffffffe98,
                 (Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffffe88.offset);
      pBVar5 = in_stack_00000010;
      in_stack_fffffffffffffe98 =
           getRangeDOFVariable(in_stack_fffffffffffffe60,
                               (BerdyDynamicVariablesTypes)
                               ((ulong)in_stack_fffffffffffffe58 >> 0x20),lVar1);
      this_00 = in_stack_00000008;
      uVar4 = (**(code **)(*plVar3 + 0xc0))();
      iDynTree::VectorDynSize::operator()(this_00,uVar4);
      range.size = (ptrdiff_t)in_stack_fffffffffffffe40;
      range.offset = (ptrdiff_t)pBVar5;
      setSubVector(this_00,range,(double)subVec);
      in_stack_fffffffffffffe88 =
           getRangeDOFVariable(in_stack_fffffffffffffe60,
                               (BerdyDynamicVariablesTypes)
                               ((ulong)in_stack_fffffffffffffe58 >> 0x20),lVar1);
      in_stack_fffffffffffffe40 = in_R9;
      uVar4 = (**(code **)(*plVar3 + 0xc0))();
      iDynTree::VectorDynSize::operator()(in_stack_fffffffffffffe40,uVar4);
      range_00.size = (ptrdiff_t)in_stack_fffffffffffffe40;
      range_00.offset = (ptrdiff_t)pBVar5;
      setSubVector(this_00,range_00,(double)subVec);
      local_100 = local_100 + 1;
    }
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFixedBase(LinkProperAccArray& properAccs,
                                                                  LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                                  LinkNetExternalWrenches& netExtWrenches,
                                                                  LinkInternalWrenches& linkJointWrenches,
                                                                  JointDOFsDoubleArray& jointTorques,
                                                                  JointDOFsDoubleArray& jointAccs,
                                                                  VectorDynSize& d)
{
    assert(d.size() == this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE);

    if( this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        // In the original formulation, also the totalNetWrenchesWithoutGravity where part of the variables
        // And the base link is not considered amoing the dynamic variables
        for(LinkIndex linkIdx = 0; linkIdx < static_cast<LinkIndex>(m_model.getNrOfLinks()); linkIdx++)
        {
            // The base variables are not estimated for ORIGINAL_BERDY_FIXED_BASE
            if( linkIdx != this->m_dynamicsTraversal.getBaseLink()->getIndex() )
            {
                setSubVector(d,getRangeLinkVariable(LINK_BODY_PROPER_ACCELERATION,linkIdx),toEigen(properAccs(linkIdx)));
                setSubVector(d,getRangeLinkVariable(NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,linkIdx),toEigen(netTotalWrenchesWithoutGrav(linkIdx)));
                if( m_options.includeAllNetExternalWrenchesAsDynamicVariables )
                {
                    setSubVector(d,getRangeLinkVariable(NET_EXT_WRENCH,linkIdx),toEigen(netExtWrenches(linkIdx)));
                }
            }
        }

        for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
        {
            IJointConstPtr jnt = m_model.getJoint(jntIdx);

            LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,jntIdx);
            setSubVector(d,getRangeJointVariable(JOINT_WRENCH,jntIdx),toEigen(linkJointWrenches(childLink)));

            // For ORIGINAL_BERDY_FIXED_BASE, we know that every joint has 1 dof
            setSubVector(d,getRangeDOFVariable(DOF_ACCELERATION,jntIdx),jointAccs(jnt->getDOFsOffset()));
            setSubVector(d,getRangeDOFVariable(DOF_TORQUE,jntIdx),jointTorques(jnt->getDOFsOffset()));
        }
    }

    return true;
}